

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Imputer::ByteSizeLong(Imputer *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  
  uVar1 = this->_oneof_case_[0];
  switch(uVar1) {
  case 1:
    sVar4 = 9;
    goto LAB_001dc650;
  case 2:
    uVar7 = (this->ImputedValue_).imputedint64value_ | 1;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar4 = 2;
    if (uVar1 == 2) {
      sVar4 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
    }
    goto LAB_001dc650;
  case 3:
    if (uVar1 == 3) {
      puVar6 = (undefined8 *)(this->ImputedValue_).imputedint64value_;
    }
    else {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    sVar4 = puVar6[1];
    break;
  case 4:
    sVar4 = DoubleVector::ByteSizeLong((this->ImputedValue_).imputeddoublearray_);
    break;
  case 5:
    sVar4 = Int64Vector::ByteSizeLong((this->ImputedValue_).imputedint64array_);
    break;
  case 6:
    sVar4 = StringToDoubleMap::ByteSizeLong((this->ImputedValue_).imputedstringdictionary_);
    break;
  case 7:
    sVar4 = Int64ToDoubleMap::ByteSizeLong((this->ImputedValue_).imputedint64dictionary_);
    break;
  default:
    sVar4 = 0;
    goto LAB_001dc650;
  }
  uVar5 = (uint)sVar4 | 1;
  iVar2 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar4 = sVar4 + (iVar2 * 9 + 0x49U >> 6) + 1;
LAB_001dc650:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0xd) {
    if (uVar1 == 0xd) {
      puVar6 = (undefined8 *)(this->ReplaceValue_).replaceint64value_;
    }
    else {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    uVar5 = (uint)puVar6[1] | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + puVar6[1] + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  else if (uVar1 == 0xc) {
    uVar7 = (this->ReplaceValue_).replaceint64value_ | 1;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar4 = sVar4 + (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  else if (uVar1 == 0xb) {
    sVar4 = sVar4 + 9;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t Imputer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Imputer)
  size_t total_size = 0;

  switch (ImputedValue_case()) {
    // double imputedDoubleValue = 1;
    case kImputedDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 imputedInt64Value = 2;
    case kImputedInt64Value: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->imputedint64value());
      break;
    }
    // string imputedStringValue = 3;
    case kImputedStringValue: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->imputedstringvalue());
      break;
    }
    // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
    case kImputedDoubleArray: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputeddoublearray_);
      break;
    }
    // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
    case kImputedInt64Array: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedint64array_);
      break;
    }
    // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
    case kImputedStringDictionary: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedstringdictionary_);
      break;
    }
    // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
    case kImputedInt64Dictionary: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedint64dictionary_);
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (ReplaceValue_case()) {
    // double replaceDoubleValue = 11;
    case kReplaceDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 replaceInt64Value = 12;
    case kReplaceInt64Value: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->replaceint64value());
      break;
    }
    // string replaceStringValue = 13;
    case kReplaceStringValue: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}